

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_nw_rowcol_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  ulong uVar5;
  undefined1 auVar6 [32];
  __m256i alVar7;
  __m256i alVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  bool bVar12;
  uint uVar13;
  int iVar14;
  parasail_result_t *ppVar15;
  __m256i *ptr;
  int64_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  bool bVar16;
  int iVar17;
  ulong uVar18;
  __m256i *palVar19;
  undefined8 uVar20;
  ulong size;
  int iVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  __m256i *palVar25;
  ulong uVar26;
  int iVar27;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar29 [32];
  
  auVar43 = in_ZMM12._0_32_;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_rowcol_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      parasail_nw_rowcol_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_nw_rowcol_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar23 = profile->s1Len;
        if ((int)uVar23 < 1) {
          parasail_nw_rowcol_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_rowcol_scan_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_rowcol_scan_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_nw_rowcol_scan_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_rowcol_scan_profile_avx2_256_64_cold_1();
        }
        else {
          uVar13 = uVar23 - 1;
          size = (ulong)uVar23 + 3 >> 2;
          uVar5 = (ulong)uVar13 % size;
          iVar14 = (int)(uVar13 / size);
          iVar27 = -open;
          iVar17 = ppVar3->min;
          uVar26 = 0x8000000000000000 - (long)iVar17;
          if (iVar17 != iVar27 && SBORROW4(iVar17,iVar27) == iVar17 + open < 0) {
            uVar26 = CONCAT44(0,open) | 0x8000000000000000;
          }
          iVar17 = ppVar3->max;
          ppVar15 = parasail_result_new_rowcol1((uint)((ulong)uVar23 + 3) & 0x7ffffffc,s2Len);
          if (ppVar15 != (parasail_result_t *)0x0) {
            ppVar15->flag = ppVar15->flag | 0x4840401;
            ptr = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            if (ptr_03 != (__m256i *)0x0 &&
                ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                (ptr_00 != (int64_t *)0x0 && ptr != (__m256i *)0x0))) {
              iVar21 = s2Len + -1;
              auVar31._8_4_ = open;
              auVar31._0_8_ = CONCAT44(0,open);
              auVar31._12_4_ = 0;
              auVar31._16_4_ = open;
              auVar31._20_4_ = 0;
              auVar31._24_4_ = open;
              auVar31._28_4_ = 0;
              auVar32._8_4_ = gap;
              auVar32._0_8_ = CONCAT44(0,gap);
              auVar32._12_4_ = 0;
              auVar32._16_4_ = gap;
              auVar32._20_4_ = 0;
              auVar32._24_4_ = gap;
              auVar32._28_4_ = 0;
              uVar26 = uVar26 + 1;
              lVar24 = 0x7ffffffffffffffe - (long)iVar17;
              auVar28._8_8_ = uVar26;
              auVar28._0_8_ = uVar26;
              auVar29._16_8_ = uVar26;
              auVar29._0_16_ = auVar28;
              auVar29._24_8_ = uVar26;
              iVar17 = (int)size;
              lVar22 = (long)-(gap * iVar17);
              auVar33._8_8_ = lVar22;
              auVar33._0_8_ = lVar22;
              auVar33._16_8_ = lVar22;
              auVar33._24_8_ = lVar22;
              auVar33 = vpblendd_avx2(auVar33,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
              auVar33 = vpaddq_avx2(ZEXT832(uVar26),auVar33);
              lVar22 = (long)iVar27;
              auVar38._4_4_ = iVar17;
              auVar38._0_4_ = iVar17;
              auVar38._8_4_ = iVar17;
              auVar38._12_4_ = iVar17;
              auVar38._16_4_ = iVar17;
              auVar38._20_4_ = iVar17;
              auVar38._24_4_ = iVar17;
              auVar38._28_4_ = iVar17;
              auVar34._8_4_ = gap;
              auVar34._0_8_ = CONCAT44(0,gap);
              auVar34._12_4_ = 0;
              auVar34._16_4_ = gap;
              auVar34._20_4_ = 0;
              auVar34._24_4_ = gap;
              auVar34._28_4_ = 0;
              auVar36._8_8_ = lVar22;
              auVar36._0_8_ = lVar22;
              auVar36._16_8_ = lVar22;
              auVar36._24_8_ = lVar22;
              auVar38 = vpmuldq_avx2(auVar38,_DAT_00908b60);
              uVar18 = 0;
              palVar19 = ptr_02;
              palVar25 = ptr;
              do {
                auVar40._8_8_ = uVar18;
                auVar40._0_8_ = uVar18;
                auVar40._16_8_ = uVar18;
                auVar40._24_8_ = uVar18;
                auVar40 = vpaddq_avx2(auVar38,auVar40);
                auVar41 = vpmuludq_avx2(auVar40,auVar34);
                auVar40 = vpsrlq_avx2(auVar40,0x20);
                auVar40 = vpmuludq_avx2(auVar40,auVar34);
                auVar40 = vpsllq_avx2(auVar40,0x20);
                auVar40 = vpaddq_avx2(auVar41,auVar40);
                alVar7 = (__m256i)vpsubq_avx2(auVar36,auVar40);
                alVar8 = (__m256i)vpsubq_avx2((undefined1  [32])alVar7,auVar31);
                *palVar19 = alVar7;
                *palVar25 = alVar8;
                uVar18 = uVar18 + 1;
                palVar25 = palVar25 + 1;
                palVar19 = palVar19 + 1;
              } while (size != uVar18);
              *ptr_00 = 0;
              lVar22 = (ulong)(uint)s2Len - 1;
              auVar42._8_8_ = lVar22;
              auVar42._0_8_ = lVar22;
              auVar42._16_8_ = lVar22;
              auVar42._24_8_ = lVar22;
              auVar38 = vpmovsxbq_avx2(ZEXT416(0x4030201));
              uVar18 = 0;
              auVar40 = vpmovsxbq_avx2(ZEXT416(0x3020100));
              auVar41._8_8_ = 0x8000000000000000;
              auVar41._0_8_ = 0x8000000000000000;
              auVar41._16_8_ = 0x8000000000000000;
              auVar41._24_8_ = 0x8000000000000000;
              auVar43 = vpcmpeqd_avx2(auVar43,auVar43);
              auVar44._8_8_ = 4;
              auVar44._0_8_ = 4;
              auVar44._16_8_ = 4;
              auVar44._24_8_ = 4;
              do {
                auVar45._8_8_ = uVar18;
                auVar45._0_8_ = uVar18;
                auVar45._16_8_ = uVar18;
                auVar45._24_8_ = uVar18;
                auVar45 = vpor_avx2(auVar45,auVar40);
                auVar39 = vpcmpgtq_avx2(auVar45 ^ auVar41,auVar42 ^ auVar41);
                auVar45 = vpaddq_avx2(auVar38,auVar43);
                auVar6 = vpmuludq_avx2(auVar45,auVar34);
                auVar45 = vpsrlq_avx2(auVar45,0x20);
                auVar45 = vpmuludq_avx2(auVar45,auVar34);
                auVar45 = vpsllq_avx2(auVar45,0x20);
                auVar45 = vpaddq_avx2(auVar45,auVar6);
                auVar45 = vpsubq_avx2(auVar36,auVar45);
                auVar45 = vpmaskmovq_avx2(auVar39 ^ auVar43,auVar45);
                *(undefined1 (*) [32])(ptr_00 + uVar18 + 1) = auVar45;
                uVar18 = uVar18 + 4;
                auVar38 = vpaddq_avx2(auVar38,auVar44);
              } while ((s2Len + 3U & 0xfffffffc) != uVar18);
              alVar7 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar31);
              palVar19 = ptr_03 + (iVar17 - 1U);
              uVar18 = size;
              do {
                *palVar19 = alVar7;
                alVar7 = (__m256i)vpsubq_avx2((undefined1  [32])alVar7,auVar32);
                palVar19 = palVar19 + -1;
                iVar27 = (int)uVar18;
                uVar23 = iVar27 - 1;
                uVar18 = (ulong)uVar23;
              } while (uVar23 != 0 && 0 < iVar27);
              auVar35 = ZEXT3264(auVar29);
              auVar43._8_8_ = lVar24;
              auVar43._0_8_ = lVar24;
              auVar43._16_8_ = lVar24;
              auVar43._24_8_ = lVar24;
              auVar37 = ZEXT3264(auVar43);
              uVar18 = 0;
              do {
                auVar30 = SUB3216(ptr_02[iVar17 - 1U],0);
                auVar39._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar28;
                auVar39._16_16_ = ZEXT116(0) * auVar29._16_16_ + ZEXT116(1) * auVar30;
                auVar38 = vpalignr_avx2((undefined1  [32])ptr_02[iVar17 - 1U],auVar39,8);
                auVar38 = vpblendd_avx2(auVar38,ZEXT832((ulong)ptr_00[uVar18]),3);
                iVar27 = ppVar3->mapper[(byte)s2[uVar18]];
                auVar36 = vpsubq_avx2(auVar29,(undefined1  [32])*ptr_03);
                lVar22 = 0;
                auVar34 = auVar29;
                do {
                  auVar41 = vpaddq_avx2(auVar38,*(undefined1 (*) [32])
                                                 ((long)pvVar2 + lVar22 + size * (long)iVar27 * 0x20
                                                 ));
                  auVar38 = *(undefined1 (*) [32])((long)*ptr_02 + lVar22);
                  auVar42 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr + lVar22),auVar32);
                  auVar36 = vpaddq_avx2(auVar36,*(undefined1 (*) [32])((long)*ptr_03 + lVar22));
                  auVar44 = vpsubq_avx2(auVar38,auVar31);
                  auVar40 = vpcmpgtq_avx2(auVar34,auVar36);
                  auVar34 = vblendvpd_avx(auVar36,auVar34,auVar40);
                  auVar36 = vpcmpgtq_avx2(auVar42,auVar44);
                  auVar40 = vblendvpd_avx(auVar44,auVar42,auVar36);
                  auVar36 = vpcmpgtq_avx2(auVar40,auVar41);
                  auVar36 = vblendvpd_avx(auVar41,auVar40,auVar36);
                  *(undefined1 (*) [32])((long)*ptr + lVar22) = auVar40;
                  *(undefined1 (*) [32])((long)*ptr_01 + lVar22) = auVar36;
                  lVar22 = lVar22 + 0x20;
                } while (size << 5 != lVar22);
                auVar40 = vpermpd_avx2(auVar36,0x90);
                uVar1 = uVar18 + 1;
                auVar38 = vblendpd_avx(auVar40,ZEXT832((ulong)ptr_00[uVar18 + 1]),1);
                auVar38 = vpaddq_avx2(auVar38,(undefined1  [32])*ptr_03);
                auVar36 = vpcmpgtq_avx2(auVar34,auVar38);
                auVar38 = vblendvpd_avx(auVar38,auVar34,auVar36);
                bVar12 = true;
                do {
                  bVar16 = bVar12;
                  auVar34 = vperm2f128_avx(auVar38,auVar38,8);
                  auVar34 = vpalignr_avx2(auVar38,auVar34,8);
                  auVar34 = vpaddq_avx2(auVar33,auVar34);
                  auVar36 = vpcmpgtq_avx2(auVar38,auVar34);
                  auVar38 = vblendvpd_avx(auVar34,auVar38,auVar36);
                  bVar12 = false;
                } while (bVar16);
                auVar34 = vperm2f128_avx(auVar38,auVar38,8);
                auVar38 = vpalignr_avx2(auVar38,auVar34,8);
                auVar34 = vpaddq_avx2(ZEXT832(uVar26),auVar38);
                auVar38 = vblendpd_avx(auVar40,ZEXT832((ulong)ptr_00[uVar18 + 1]),1);
                auVar36 = vpcmpgtq_avx2(auVar38,auVar34);
                auVar38 = vblendvpd_avx(auVar34,auVar38,auVar36);
                lVar22 = 0;
                do {
                  auVar34 = vpsubq_avx2(auVar34,auVar32);
                  auVar36 = vpsubq_avx2(auVar38,auVar31);
                  auVar38 = vpcmpgtq_avx2(auVar34,auVar36);
                  auVar34 = vblendvpd_avx(auVar36,auVar34,auVar38);
                  auVar38 = *(undefined1 (*) [32])((long)*ptr_01 + lVar22);
                  auVar36 = vpcmpgtq_avx2(auVar38,auVar34);
                  auVar38 = vblendvpd_avx(auVar34,auVar38,auVar36);
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar22) = auVar38;
                  auVar36 = vpcmpgtq_avx2(auVar38,auVar37._0_32_);
                  auVar36 = vblendvpd_avx(auVar38,auVar37._0_32_,auVar36);
                  auVar37 = ZEXT3264(auVar36);
                  auVar40 = vpcmpgtq_avx2(auVar35._0_32_,auVar38);
                  auVar40 = vblendvpd_avx(auVar38,auVar35._0_32_,auVar40);
                  auVar35 = ZEXT3264(auVar40);
                  lVar22 = lVar22 + 0x20;
                } while (size << 5 != lVar22);
                alVar7 = ptr_02[uVar5];
                auVar30 = alVar7._16_16_;
                if (iVar14 < 3) {
                  iVar27 = 0;
                  do {
                    auVar38 = vperm2i128_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar7,8);
                    alVar7 = (__m256i)vpalignr_avx2((undefined1  [32])alVar7,auVar38,8);
                    auVar30 = alVar7._16_16_;
                    iVar27 = iVar27 + 1;
                  } while (iVar27 < 3 - iVar14);
                }
                ((ppVar15->field_4).rowcols)->score_row[uVar18] = auVar30._8_4_;
                uVar18 = uVar1;
              } while (uVar1 != (uint)s2Len);
              lVar22 = 0;
              do {
                piVar4 = ((ppVar15->field_4).rowcols)->score_col;
                lVar9 = (*ptr_02 + lVar22)[1];
                lVar10 = (*ptr_02)[lVar22 + 2];
                lVar11 = (*ptr_02 + lVar22 + 2)[1];
                *(int *)((long)piVar4 + lVar22) = (int)(*ptr_02)[lVar22];
                *(int *)((long)piVar4 + size * 4 + lVar22) = (int)lVar9;
                *(int *)((long)piVar4 + size * 8 + lVar22) = (int)lVar10;
                *(int *)((long)piVar4 + size * 0xc + lVar22) = (int)lVar11;
                lVar22 = lVar22 + 4;
              } while (size * 4 - lVar22 != 0);
              alVar7 = ptr_02[uVar5];
              auVar28 = alVar7._16_16_;
              if (iVar14 < 3) {
                iVar17 = 0;
                do {
                  auVar33 = vperm2i128_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar7,8);
                  alVar7 = (__m256i)vpalignr_avx2((undefined1  [32])alVar7,auVar33,8);
                  auVar28 = alVar7._16_16_;
                  iVar17 = iVar17 + 1;
                } while (iVar17 < 3 - iVar14);
              }
              auVar33 = vpcmpgtq_avx2(auVar29,auVar36);
              auVar43 = vpcmpgtq_avx2(auVar40,auVar43);
              auVar43 = vpor_avx2(auVar43,auVar33);
              if ((((auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   SUB321(auVar43 >> 0x7f,0) == '\0') && SUB321(auVar43 >> 0xbf,0) == '\0') &&
                  -1 < auVar43[0x1f]) {
                uVar20 = vpextrq_avx(auVar28,1);
                iVar17 = (int)uVar20;
              }
              else {
                *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
                iVar17 = 0;
                iVar21 = 0;
                uVar13 = 0;
              }
              ppVar15->score = iVar17;
              ppVar15->end_query = uVar13;
              ppVar15->end_ref = iVar21;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar15;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}